

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O3

void symmetric_nic_tcp_main(void)

{
  ushort uVar1;
  __time_t _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  epoll_event *__events;
  ssize_t sVar6;
  timestamp_info *b;
  request *prVar7;
  ssize_t sVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  uint32_t bytes;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  uint64_t uVar15;
  uint32_t uVar16;
  tcp_connection *conn;
  long in_FS_OFFSET;
  byte_req_pair bVar17;
  timespec ts_1;
  timespec latency;
  msghdr hdr;
  timestamp_info rx_timestamp;
  timespec local_c8;
  long local_b8;
  int local_ac;
  ulong local_a8;
  epoll_event *local_a0;
  timespec local_98;
  msghdr local_88;
  timestamp_info local_48;
  
  iVar3 = throughput_open_connections();
  if (iVar3 != 0) {
    return;
  }
  iVar3 = get_conn_count();
  local_ac = get_thread_count();
  local_ac = iVar3 / local_ac;
  __events = (epoll_event *)malloc((long)local_ac * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  iVar3 = clock_gettime(1,(timespec *)&local_88);
  if (iVar3 == 0) {
    local_b8 = (long)((double)(long)local_88.msg_name * 1000000000.0 + (double)(long)local_88._8_8_)
    ;
    local_a0 = __events;
LAB_00109bf5:
    do {
      iVar3 = should_load();
      if (iVar3 == 0) {
        do {
          iVar3 = clock_gettime(1,&local_c8);
          lVar11 = local_c8.tv_nsec;
          _Var2 = local_c8.tv_sec;
          if (iVar3 != 0) goto LAB_0010a03f;
          iVar3 = should_load();
        } while (iVar3 == 0);
        local_b8 = (long)((double)_Var2 * 1000000000.0 + (double)lVar11);
      }
      iVar3 = clock_gettime(1,&local_c8);
      if (iVar3 != 0) break;
      if (local_b8 <= (long)((double)local_c8.tv_sec * 1000000000.0 + (double)local_c8.tv_nsec)) {
        uVar5 = *(uint *)(in_FS_OFFSET + -0x1e0);
        *(uint *)(in_FS_OFFSET + -0x1e0) = uVar5 + 1;
        iVar3 = get_conn_count();
        iVar4 = get_thread_count();
        lVar11 = *(long *)(in_FS_OFFSET + -0x1f0);
        lVar12 = (long)(int)((ulong)uVar5 % ((long)iVar3 / (long)iVar4 & 0xffffffffU)) * 0x400c;
        uVar1 = *(ushort *)(lVar11 + 8 + lVar12);
        iVar3 = get_max_pending_reqs();
        if (((int)(uint)uVar1 < iVar3) &&
           (piVar13 = (int *)(lVar11 + lVar12), *(short *)((long)piVar13 + 6) == 0)) {
          prVar7 = prepare_request();
          if ((long)prVar7->iov_cnt < 1) {
            bytes = 0;
          }
          else {
            lVar11 = 0;
            bytes = 0;
            do {
              bytes = bytes + *(int *)((long)&prVar7->iovs[0].iov_len + lVar11);
              lVar11 = lVar11 + 0x10;
            } while ((long)prVar7->iov_cnt * 0x10 != lVar11);
          }
          local_88.msg_control = (void *)0x0;
          local_88.msg_controllen = 0;
          local_88.msg_name = (void *)0x0;
          local_88._8_8_ = 0;
          local_88.msg_flags = 0;
          local_88._52_4_ = 0;
          local_88.msg_iov = (iovec *)prVar7->iovs;
          local_88.msg_iovlen = (size_t)prVar7->iov_cnt;
          sVar8 = sendmsg(*piVar13,&local_88,0);
          uVar16 = (uint32_t)sVar8;
          if (((int)uVar16 < 0) && (piVar9 = __errno_location(), *piVar9 != 0xb)) {
            symmetric_nic_tcp_main_cold_1();
            return;
          }
          if (bytes != uVar16) {
            __assert_fail("ret == bytes_to_send",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                          ,0x1d0,"void symmetric_nic_tcp_main(void)");
          }
          add_pending_tx_timestamp
                    ((pending_tx_timestamps *)
                     ((ulong)((uint)*(ushort *)(piVar13 + 1) * 0x18) +
                     *(long *)(in_FS_OFFSET + -0x1e8)),bytes);
          *(short *)(piVar13 + 2) = (short)piVar13[2] + 1;
          bVar17.bytes = (uint64_t)(int)uVar16;
          bVar17.reqs = 1;
          add_throughput_tx_sample(bVar17);
          lVar11 = get_ia();
          local_b8 = local_b8 + lVar11;
        }
      }
      uVar5 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1f8),__events,local_ac,0);
      if (0 < (int)uVar5) {
        local_a8 = (ulong)uVar5;
        uVar14 = 0;
        uVar10 = local_a8;
        do {
          while( true ) {
            conn = (tcp_connection *)
                   ((long)*(int *)(&__events->field_0x4 + uVar14 * 0xc) * 0x400c +
                   *(long *)(in_FS_OFFSET + -0x1f0));
            if (((&__events->events)[uVar14 * 3] & 1) != 0) break;
            if (((&__events->events)[uVar14 * 3] & 8) == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                            ,0x21e,"void symmetric_nic_tcp_main(void)");
            }
            get_tx_timestamp(conn->fd,(pending_tx_timestamps *)
                                      ((ulong)((uint)conn->idx * 0x18) +
                                      *(long *)(in_FS_OFFSET + -0x1e8)));
LAB_00109eb7:
            iVar3 = clock_gettime(1,&local_c8);
            if (iVar3 != 0) goto LAB_0010a03f;
            uVar14 = uVar14 + 1;
            if ((local_b8 <
                 (long)((double)local_c8.tv_sec * 1000000000.0 + (double)local_c8.tv_nsec)) ||
               (uVar14 == uVar10)) goto LAB_00109bf5;
          }
          sVar6 = timestamp_recv(conn->fd,conn->buffer + conn->buffer_idx,
                                 0x4000 - (ulong)conn->buffer_idx,0,&local_48);
          if ((int)sVar6 < 0) {
            piVar13 = __errno_location();
            if (*piVar13 != 0xb) {
              symmetric_nic_tcp_main_cold_3();
              return;
            }
LAB_00109db0:
            conn->buffer_idx = conn->buffer_idx + (short)sVar6;
            bVar17 = handle_response(conn);
            if (bVar17.reqs != 0) {
              conn->pending_reqs = conn->pending_reqs - (short)bVar17.reqs;
              uVar15 = 0;
              do {
                b = pop_pending_tx_timestamps
                              ((pending_tx_timestamps *)
                               ((ulong)((uint)conn->idx * 0x18) + *(long *)(in_FS_OFFSET + -0x1e8)))
                ;
                if (b == (timestamp_info *)0x0) {
                  do {
                    iVar3 = get_tx_timestamp(conn->fd,(pending_tx_timestamps *)
                                                      ((ulong)((uint)conn->idx * 0x18) +
                                                      *(long *)(in_FS_OFFSET + -0x1e8)));
                  } while (iVar3 != 1);
                  lVar11 = *(long *)(in_FS_OFFSET + -0x1e8);
                  uVar10 = (ulong)conn->idx;
                  if (*(uint *)(lVar11 + 8 + uVar10 * 0x18) <=
                      *(uint *)(lVar11 + 0xc + uVar10 * 0x18)) {
                    __assert_fail("per_conn_tx_timestamps[conn->idx].consumed < per_conn_tx_timestamps[conn->idx].tail"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                  ,0x20c,"void symmetric_nic_tcp_main(void)");
                  }
                  b = pop_pending_tx_timestamps((pending_tx_timestamps *)(lVar11 + uVar10 * 0x18));
                  if (b == (timestamp_info *)0x0) {
                    __assert_fail("tx_timestamp",
                                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                  ,0x20f,"void symmetric_nic_tcp_main(void)");
                  }
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != bVar17.reqs);
              iVar3 = timespec_diff(&local_98,&local_48.time,&b->time);
              if (iVar3 != 0) {
                __assert_fail("ret == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                              ,0x214,"void symmetric_nic_tcp_main(void)");
              }
              add_latency_sample((long)((double)local_98.tv_sec * 1000000000.0 +
                                       (double)local_98.tv_nsec),&b->time);
              add_throughput_rx_sample(bVar17);
              uVar10 = local_a8;
              __events = local_a0;
              goto LAB_00109eb7;
            }
          }
          else {
            if ((int)sVar6 != 0) goto LAB_00109db0;
            symmetric_nic_tcp_main_cold_2();
          }
          uVar14 = uVar14 + 1;
          uVar10 = local_a8;
        } while (uVar14 != local_a8);
      }
    } while( true );
  }
LAB_0010a03f:
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                ,0x28,"int64_t time_ns()");
}

Assistant:

static void symmetric_nic_tcp_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx;
	struct epoll_event *events;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timestamp_info rx_timestamp, *tx_timestamp;
	struct msghdr hdr;
	struct timespec latency;

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		if (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;

			to_send = prepare_request();
			// send once
			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			bzero(&hdr, sizeof(hdr));
			hdr.msg_iov = to_send->iovs;
			hdr.msg_iovlen = to_send->iov_cnt;

			ret = sendmsg(conn->fd, &hdr, 0);
			if ((ret < 0) && (errno != EWOULDBLOCK)) {
				lancet_perror("Unknown connection error write\n");
				return;
			}
			assert(ret == bytes_to_send);
			add_pending_tx_timestamp(&per_conn_tx_timestamps[conn->idx],
									 bytes_to_send);
			conn->pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}
	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			if (events[i].events & EPOLLIN) {
				// read into the connection buffer
				ret = timestamp_recv(conn->fd, &conn->buffer[conn->buffer_idx],
									 MAX_PAYLOAD - conn->buffer_idx, 0,
									 &rx_timestamp);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error read\n");
					return;
				}
				if (ret == 0) {
					close(conn->fd);
					lancet_fprintf(stderr, "Connection closed\n");
					conn->closed = 1;
					continue;
				}
				conn->buffer_idx += ret;
				read_res = handle_response(conn);
				if (read_res.reqs == 0) {
					continue;
				}

				// assert(read_res.reqs >= 1);
				// no need for assert because it must be true based on data type
				conn->pending_reqs -= read_res.reqs;
				assert(conn->pending_reqs >= 0);

				/*
				 * Assume only the last request will have an rx timestamp!
				 */
				for (j = 0; j < read_res.reqs; j++) {
					tx_timestamp = pop_pending_tx_timestamps(
						&per_conn_tx_timestamps[conn->idx]);
					if (!tx_timestamp) {
						ret = get_tx_timestamp(
							conn->fd, &per_conn_tx_timestamps[conn->idx]);
						while (ret != 1)
							ret = get_tx_timestamp(
								conn->fd, &per_conn_tx_timestamps[conn->idx]);
						assert(ret == 1);
						assert(per_conn_tx_timestamps[conn->idx].consumed <
							   per_conn_tx_timestamps[conn->idx].tail);
						tx_timestamp = pop_pending_tx_timestamps(
							&per_conn_tx_timestamps[conn->idx]);
						assert(tx_timestamp);
					}
				}
				ret = timespec_diff(&latency, &rx_timestamp.time,
									&tx_timestamp->time);
				assert(ret == 0);
				long diff = latency.tv_nsec + latency.tv_sec * 1e9;
				add_latency_sample(diff, &tx_timestamp->time);

				/* Bookkeeping */
				add_throughput_rx_sample(read_res);
			} else if (events[i].events & EPOLLERR) {
				/* Get tx timetamps */
				get_tx_timestamp(conn->fd, &per_conn_tx_timestamps[conn->idx]);
			} else
				assert(0);

			if ((time_ns() - next_tx) > 0)
				break;
		}
	}
}